

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCMaterial.cpp
# Opt level: O1

uint Assimp::IFC::ProcessMaterials
               (uint64_t id,uint prevMatId,ConversionData *conv,bool forceDefaultMat)

{
  DataType *pDVar1;
  _Base_ptr p_Var2;
  pointer ppaVar3;
  ulong uVar4;
  __uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_> _Var5;
  IfcSurfaceStyle *pIVar6;
  size_type sVar7;
  int iVar8;
  LazyObject *this;
  Object *pOVar9;
  long lVar10;
  IfcPresentationStyleAssignment *pIVar11;
  IfcSurfaceStyle *pIVar12;
  _Rb_tree_header *p_Var13;
  tuple<aiMaterial_*,_std::default_delete<aiMaterial>_> this_00;
  IfcSurfaceStyleShading *pIVar14;
  IfcColourRgb *in;
  long *plVar15;
  mapped_type *pmVar16;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> _Var17;
  aiMaterial *this_01;
  undefined7 in_register_00000009;
  undefined8 *puVar18;
  _Rb_tree_header *p_Var19;
  size_type *psVar20;
  uint uVar21;
  ulong unaff_RBX;
  pointer psVar22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var23;
  undefined4 uVar24;
  pointer ppaVar25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  ulong uVar26;
  bool bVar27;
  bool bVar28;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  pVar29;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> mat;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> mat_1;
  aiColor4D col_1;
  int shading;
  aiColor4D col_base;
  IfcSurfaceStyle *surf;
  string side;
  aiColor4D col;
  aiString name;
  int local_948;
  int local_944;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_940;
  __uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_> local_920;
  aiColor4D local_918;
  undefined8 *local_908;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_900;
  undefined4 local_8f4;
  uint local_8f0;
  undefined4 local_8ec;
  aiColor4D local_8e8;
  IfcSurfaceStyle *local_8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b0;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> local_890;
  _Base_ptr local_888;
  undefined8 *local_880;
  MaterialCache *local_878;
  vector<aiMaterial*,std::allocator<aiMaterial*>> *local_870;
  _Rb_tree_header *local_868;
  undefined8 *local_860;
  undefined8 *local_858;
  pointer local_850;
  uint64_t local_848;
  undefined1 local_840 [8];
  size_type sStack_838;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_830 [6];
  ios_base local_7d0 [920];
  aiString local_438;
  
  local_8f4 = (undefined4)CONCAT71(in_register_00000009,forceDefaultMat);
  local_8f0 = prevMatId;
  local_848 = id;
  pVar29 = std::
           _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::equal_range(&(conv->db->refs)._M_t,&local_848);
  local_890 = pVar29.second._M_node;
  if (pVar29.first._M_node._M_node != local_890._M_node) {
    local_878 = &conv->cached_materials;
    local_868 = &(conv->cached_materials)._M_t._M_impl.super__Rb_tree_header;
    local_870 = (vector<aiMaterial*,std::allocator<aiMaterial*>> *)&conv->materials;
    do {
      local_890 = pVar29.second._M_node;
      local_888 = (_Base_ptr)pVar29.first._M_node;
      this = STEP::DB::GetObject(conv->db,(uint64_t)local_888[1]._M_parent);
      pOVar9 = STEP::LazyObject::operator*(this);
      lVar10 = __dynamic_cast(pOVar9,&STEP::Object::typeinfo,&Schema_2x3::IfcStyledItem::typeinfo,
                              0xffffffffffffffff);
      if (lVar10 == 0) {
        bVar27 = true;
      }
      else {
        puVar18 = *(undefined8 **)(lVar10 + 0x30);
        local_880 = *(undefined8 **)(lVar10 + 0x38);
        local_948 = 5;
        if (puVar18 != local_880) {
          do {
            local_908 = puVar18;
            pIVar11 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment>
                                ((LazyObject *)*puVar18);
            puVar18 = *(undefined8 **)
                       &(pIVar11->
                        super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment,_1UL>
                        ).field_0x10;
            local_860 = *(undefined8 **)
                         &(pIVar11->
                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment,_1UL>
                          ).field_0x18;
            local_944 = 0;
            bVar27 = puVar18 == local_860;
            while (!bVar27) {
              pDVar1 = (DataType *)*puVar18;
              p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar18[1];
              if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
                }
              }
              local_858 = puVar18;
              pIVar12 = STEP::EXPRESS::DataType::
                        ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcSurfaceStyle>(pDVar1,conv->db);
              local_8d8 = pIVar12;
              if (pIVar12 != (IfcSurfaceStyle *)0x0) {
                p_Var13 = local_868;
                for (p_Var2 = (conv->cached_materials)._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_parent; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
                    p_Var2 = (&p_Var2->_M_left)[*(IfcSurfaceStyle **)(p_Var2 + 1) < pIVar12]) {
                  if (*(IfcSurfaceStyle **)(p_Var2 + 1) >= pIVar12) {
                    p_Var13 = (_Rb_tree_header *)p_Var2;
                  }
                }
                p_Var19 = local_868;
                if ((p_Var13 != local_868) &&
                   (p_Var19 = p_Var13, pIVar12 < (IfcSurfaceStyle *)p_Var13->_M_node_count)) {
                  p_Var19 = local_868;
                }
                if (p_Var19 == local_868) {
                  lVar10 = *(long *)&(pIVar12->super_IfcPresentationStyle).field_0x48;
                  local_8d0._M_dataplus._M_p = (pointer)&local_8d0.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_8d0,lVar10,*(long *)&pIVar12->field_0x50 + lVar10);
                  iVar8 = std::__cxx11::string::compare((char *)&local_8d0);
                  if (iVar8 != 0) {
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_840,
                                   "ignoring surface side marker on IFC::IfcSurfaceStyle: ",
                                   &local_8d0);
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    basic_formatter<std::__cxx11::string>
                              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                               &local_438,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_840);
                    LogFunctions<Assimp::IFCImporter>::LogWarn((format *)&local_438);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_438);
                    std::ios_base::~ios_base((ios_base *)(local_438.data + 0x6c));
                    if (local_840 != (undefined1  [8])local_830) {
                      operator_delete((void *)local_840,
                                      (ulong)(local_830[0]._M_allocated_capacity + 1));
                    }
                  }
                  this_00.super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
                  super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl =
                       (_Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>)
                       operator_new(0x10);
                  aiMaterial::aiMaterial
                            ((aiMaterial *)
                             this_00.
                             super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
                             super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl);
                  pIVar6 = local_8d8;
                  local_438.length = 0;
                  local_438.data._0_4_ = local_438.data._0_4_ & 0xffffff00;
                  local_920._M_t.
                  super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
                  super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl =
                       (tuple<aiMaterial_*,_std::default_delete<aiMaterial>_>)
                       (tuple<aiMaterial_*,_std::default_delete<aiMaterial>_>)
                       this_00.
                       super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
                       super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl;
                  memset(local_438.data + 1,0x1b,0x3ff);
                  if ((pIVar6->super_IfcPresentationStyle).field_0x30 == '\x01') {
                    local_840 = (undefined1  [8])local_830;
                    lVar10 = *(long *)&(pIVar6->super_IfcPresentationStyle).
                                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>
                                       .field_0x10;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_840,lVar10,
                               *(long *)&(pIVar6->super_IfcPresentationStyle).
                                         super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>
                                         .field_0x18 + lVar10);
                  }
                  else {
                    local_840 = (undefined1  [8])local_830;
                    local_940._M_dataplus._M_p = (pointer)0x17;
                    local_840 = (undefined1  [8])
                                std::__cxx11::string::_M_create
                                          ((ulong *)local_840,(ulong)&local_940);
                    local_830[0]._M_allocated_capacity = local_940._M_dataplus._M_p;
                    *(undefined8 *)local_840 = 0x6166727553636649;
                    *(char *)((long)local_840 + 8) = 'c';
                    *(char *)((long)local_840 + 9) = 'e';
                    *(char *)((long)local_840 + 10) = 'S';
                    *(char *)((long)local_840 + 0xb) = 't';
                    *(char *)((long)local_840 + 0xc) = 'y';
                    *(char *)((long)local_840 + 0xd) = 'l';
                    *(char *)((long)local_840 + 0xe) = 'e';
                    *(char *)((long)local_840 + 0xf) = '_';
                    *(char *)((long)local_840 + 0xf) = '_';
                    *(char *)((long)local_840 + 0x10) = 'U';
                    *(char *)((long)local_840 + 0x11) = 'n';
                    *(char *)((long)local_840 + 0x12) = 'n';
                    *(char *)((long)local_840 + 0x13) = 'a';
                    *(char *)((long)local_840 + 0x14) = 'm';
                    *(char *)((long)local_840 + 0x15) = 'e';
                    *(char *)((long)local_840 + 0x16) = 'd';
                    sStack_838 = (size_type)local_940._M_dataplus._M_p;
                    *(char *)((long)local_840 + (long)local_940._M_dataplus._M_p) = '\0';
                  }
                  sVar7 = sStack_838;
                  if (sStack_838 <
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x400) {
                    local_438.length = (ai_uint32)sStack_838;
                    memcpy(local_438.data,(void *)local_840,sStack_838);
                    local_438.data[sVar7] = '\0';
                  }
                  if (local_840 != (undefined1  [8])local_830) {
                    operator_delete((void *)local_840,
                                    (ulong)(local_830[0]._M_allocated_capacity + 1));
                  }
                  aiMaterial::AddProperty
                            ((aiMaterial *)
                             this_00.
                             super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
                             super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,&local_438,
                             "?mat.name",0,0);
                  psVar22 = (pIVar6->Styles).
                            super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                            .
                            super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  local_850 = (pIVar6->Styles).
                              super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                              .
                              super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  local_900 = p_Var23;
                  if (psVar22 != local_850) {
                    do {
                      pDVar1 = (psVar22->
                               super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr;
                      p_Var23 = (psVar22->
                                super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                                )._M_refcount._M_pi;
                      if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
                        }
                      }
                      pIVar14 = STEP::EXPRESS::DataType::
                                ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading>
                                          (pDVar1,conv->db);
                      if (pIVar14 != (IfcSurfaceStyleShading *)0x0) {
                        local_8e8.r = 0.0;
                        local_8e8.g = 0.0;
                        local_8e8.b = 0.0;
                        local_8e8.a = 0.0;
                        local_918.r = 0.0;
                        local_918.g = 0.0;
                        local_918.b = 0.0;
                        local_918.a = 0.0;
                        in = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcColourRgb>
                                       (*(LazyObject **)
                                         &(pIVar14->
                                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>
                                          ).field_0x10);
                        ConvertColor(&local_8e8,in);
                        aiMaterial::AddBinaryProperty
                                  ((aiMaterial *)
                                   this_00.
                                   super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                                   .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,
                                   &local_8e8,0x10,"$clr.diffuse",0,0,aiPTI_Float);
                        lVar10 = __dynamic_cast((_func_int *)
                                                ((long)&(pIVar14->
                                                                                                                
                                                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>
                                                  )._vptr_ObjectHelper +
                                                (long)(pIVar14->
                                                                                                            
                                                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>
                                                  )._vptr_ObjectHelper[-3]),&STEP::Object::typeinfo,
                                                &Schema_2x3::IfcSurfaceStyleRendering::typeinfo,
                                                0xffffffffffffffff);
                        if (lVar10 != 0) {
                          if (*(char *)(lVar10 + 0x30) == '\x01') {
                            local_840._0_4_ = 1.0 - (float)*(double *)(lVar10 + 0x28);
                            aiMaterial::AddBinaryProperty
                                      ((aiMaterial *)
                                       this_00.
                                       super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                                       .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,
                                       local_840,4,"$mat.opacity",0,0,aiPTI_Float);
                          }
                          if (*(char *)(lVar10 + 0x48) == '\x01') {
                            ConvertColor(&local_918,*(IfcColourOrFactor **)(lVar10 + 0x38),conv,
                                         &local_8e8);
                            aiMaterial::AddBinaryProperty
                                      ((aiMaterial *)
                                       this_00.
                                       super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                                       .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,
                                       &local_918,0x10,"$clr.diffuse",0,0,aiPTI_Float);
                          }
                          if (*(char *)(lVar10 + 0xa8) == '\x01') {
                            ConvertColor(&local_918,*(IfcColourOrFactor **)(lVar10 + 0x98),conv,
                                         &local_8e8);
                            aiMaterial::AddBinaryProperty
                                      ((aiMaterial *)
                                       this_00.
                                       super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                                       .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,
                                       &local_918,0x10,"$clr.specular",0,0,aiPTI_Float);
                          }
                          if (*(char *)(lVar10 + 0x60) == '\x01') {
                            ConvertColor(&local_918,*(IfcColourOrFactor **)(lVar10 + 0x50),conv,
                                         &local_8e8);
                            aiMaterial::AddBinaryProperty
                                      ((aiMaterial *)
                                       this_00.
                                       super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                                       .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,
                                       &local_918,0x10,"$clr.transparent",0,0,aiPTI_Float);
                          }
                          if (*(char *)(lVar10 + 0x90) == '\x01') {
                            ConvertColor(&local_918,*(IfcColourOrFactor **)(lVar10 + 0x80),conv,
                                         &local_8e8);
                            aiMaterial::AddBinaryProperty
                                      ((aiMaterial *)
                                       this_00.
                                       super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                                       .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,
                                       &local_918,0x10,"$clr.reflective",0,0,aiPTI_Float);
                          }
                          uVar24 = 2;
                          if ((*(char *)(lVar10 + 0xc0) == '\x01') &&
                             (*(char *)(lVar10 + 0xa8) == '\x01')) {
                            __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(lVar10 + 200);
                            iVar8 = std::__cxx11::string::compare((char *)__rhs);
                            if (iVar8 == 0) {
                              uVar24 = 4;
                            }
                            else {
                              iVar8 = std::__cxx11::string::compare((char *)__rhs);
                              uVar24 = 9;
                              if ((iVar8 != 0) &&
                                 (iVar8 = std::__cxx11::string::compare((char *)__rhs), iVar8 != 0))
                              {
                                iVar8 = std::__cxx11::string::compare((char *)__rhs);
                                uVar24 = 3;
                                if (iVar8 != 0) {
                                  std::operator+(&local_8b0,"shading mode ",__rhs);
                                  plVar15 = (long *)std::__cxx11::string::append((char *)&local_8b0)
                                  ;
                                  local_940._M_dataplus._M_p = (pointer)&local_940.field_2;
                                  psVar20 = (size_type *)(plVar15 + 2);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)*plVar15 ==
                                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)psVar20) {
                                    local_940.field_2._M_allocated_capacity = *psVar20;
                                    local_940.field_2._8_8_ = plVar15[3];
                                  }
                                  else {
                                    local_940.field_2._M_allocated_capacity = *psVar20;
                                    local_940._M_dataplus._M_p = (pointer)*plVar15;
                                  }
                                  local_940._M_string_length = plVar15[1];
                                  *plVar15 = (long)psVar20;
                                  plVar15[1] = 0;
                                  *(undefined1 *)(plVar15 + 2) = 0;
                                  Formatter::
                                  basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                  ::basic_formatter<std::__cxx11::string>
                                            ((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                              *)local_840,&local_940);
                                  LogFunctions<Assimp::IFCImporter>::LogWarn((format *)local_840);
                                  std::__cxx11::ostringstream::~ostringstream
                                            ((ostringstream *)local_840);
                                  std::ios_base::~ios_base(local_7d0);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_940._M_dataplus._M_p != &local_940.field_2) {
                                    operator_delete(local_940._M_dataplus._M_p,
                                                    local_940.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_8b0._M_dataplus._M_p != &local_8b0.field_2) {
                                    operator_delete(local_8b0._M_dataplus._M_p,
                                                    local_8b0.field_2._M_allocated_capacity + 1);
                                  }
                                }
                              }
                            }
                          }
                          local_8ec = uVar24;
                          aiMaterial::AddBinaryProperty
                                    ((aiMaterial *)
                                     this_00.
                                     super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                                     .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,
                                     &local_8ec,4,"$mat.shadingm",0,0,aiPTI_Integer);
                          if (*(char *)(lVar10 + 0xc0) == '\x01') {
                            lVar10 = __dynamic_cast(*(undefined8 *)(lVar10 + 0xb0),
                                                    &STEP::EXPRESS::DataType::typeinfo,
                                                    &STEP::EXPRESS::PrimitiveDataType<double>::
                                                     typeinfo,0);
                            if (lVar10 == 0) {
                              LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x5cffb6);
                            }
                            else {
                              local_840._0_4_ = (float)*(double *)(lVar10 + 8);
                              aiMaterial::AddBinaryProperty
                                        ((aiMaterial *)
                                         this_00.
                                         super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                                         .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,
                                         local_840,4,"$mat.shininess",0,0,aiPTI_Float);
                            }
                          }
                        }
                      }
                      if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var23);
                      }
                      psVar22 = psVar22 + 1;
                    } while (psVar22 != local_850);
                  }
                  _Var5._M_t.super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
                  super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl =
                       (tuple<aiMaterial_*,_std::default_delete<aiMaterial>_>)
                       (tuple<aiMaterial_*,_std::default_delete<aiMaterial>_>)local_920;
                  local_920._M_t.
                  super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
                  super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl =
                       (tuple<aiMaterial_*,_std::default_delete<aiMaterial>_>)
                       (_Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>)0x0;
                  local_438.length =
                       (ai_uint32)
                       _Var5._M_t.
                       super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
                       super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl;
                  local_438.data._0_4_ =
                       _Var5._M_t.
                       super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
                       super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl._4_4_;
                  std::vector<aiMaterial*,std::allocator<aiMaterial*>>::emplace_back<aiMaterial*>
                            (local_870,(aiMaterial **)&local_438);
                  p_Var23 = local_900;
                  ppaVar25 = (conv->materials).
                             super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl
                             .super__Vector_impl_data._M_start;
                  ppaVar3 = (conv->materials).
                            super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                  pmVar16 = std::
                            map<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*,_unsigned_int,_std::less<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*>,_std::allocator<std::pair<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*const,_unsigned_int>_>_>
                            ::operator[](local_878,&local_8d8);
                  uVar21 = (int)((ulong)((long)ppaVar3 - (long)ppaVar25) >> 3) - 1;
                  unaff_RBX = (ulong)uVar21;
                  *pmVar16 = uVar21;
                  std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::~unique_ptr
                            ((unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)&local_920)
                  ;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_8d0._M_dataplus._M_p != &local_8d0.field_2) {
                    operator_delete(local_8d0._M_dataplus._M_p,
                                    local_8d0.field_2._M_allocated_capacity + 1);
                  }
                }
                else {
                  unaff_RBX = (ulong)*(uint *)(p_Var19 + 1);
                }
              }
              if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var23);
              }
              if (pIVar12 != (IfcSurfaceStyle *)0x0) {
                local_944 = 1;
                break;
              }
              puVar18 = local_858 + 2;
              bVar27 = puVar18 == local_860;
            }
            if (!bVar27) {
              local_948 = local_944;
              break;
            }
            puVar18 = local_908 + 1;
          } while (puVar18 != local_880);
        }
        bVar27 = local_948 == 0 || local_948 == 5;
      }
      if (!bVar27) {
        return (uint)unaff_RBX;
      }
      _Var17._M_node = (_Base_ptr)std::_Rb_tree_increment(local_888);
      pVar29.second._M_node = local_890._M_node;
      pVar29.first._M_node = _Var17._M_node;
    } while (_Var17._M_node != local_890._M_node);
  }
  uVar21 = local_8f0;
  if ((char)local_8f4 == '\x01' && local_8f0 == 0xffffffff) {
    local_438.length = 0;
    local_438.data._0_4_ = local_438.data._0_4_ & 0xffffff00;
    memset(local_438.data + 1,0x1b,0x3ff);
    local_438.length = 0xc;
    builtin_strncpy(local_438.data,"<IFCDefault>",0xd);
    ppaVar25 = (conv->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    bVar27 = (conv->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
             _M_impl.super__Vector_impl_data._M_finish != ppaVar25;
    uVar21 = (uint)unaff_RBX;
    if (bVar27) {
      uVar26 = 0;
      do {
        local_840 = (undefined1  [8])((ulong)local_840 & 0xffffff0000000000);
        memset(local_840 + 5,0x1b,0x3ff);
        bVar28 = false;
        aiGetMaterialString(ppaVar25[uVar26],"?mat.name",0,0,(aiString *)local_840);
        if (local_438.length == local_840._0_4_) {
          iVar8 = bcmp(local_438.data,local_840 + 4,(ulong)local_438.length);
          bVar28 = iVar8 == 0;
        }
        uVar4 = unaff_RBX;
        if (bVar28) {
          uVar4 = uVar26;
        }
        unaff_RBX = uVar4 & 0xffffffff;
        uVar21 = (uint)uVar4;
        if (bVar28) break;
        uVar26 = uVar26 + 1;
        ppaVar25 = (conv->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        bVar27 = uVar26 < (ulong)((long)(conv->materials).
                                        super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppaVar25
                                 >> 3);
      } while (bVar27);
    }
    if (!bVar27) {
      this_01 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(this_01);
      local_940._M_dataplus._M_p = (pointer)this_01;
      aiMaterial::AddProperty(this_01,&local_438,"?mat.name",0,0);
      local_840 = (undefined1  [8])0x3f19999a3f19999a;
      sStack_838 = 0x3f8000003f19999a;
      aiMaterial::AddBinaryProperty
                ((aiMaterial *)local_940._M_dataplus._M_p,local_840,0x10,"$clr.diffuse",0,0,
                 aiPTI_Float);
      local_8b0._M_dataplus._M_p = local_940._M_dataplus._M_p;
      local_940._M_dataplus._M_p = (pointer)0x0;
      std::vector<aiMaterial*,std::allocator<aiMaterial*>>::emplace_back<aiMaterial*>
                ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&conv->materials,
                 (aiMaterial **)&local_8b0);
      uVar21 = (int)((ulong)((long)(conv->materials).
                                   super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(conv->materials).
                                  super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
      std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::~unique_ptr
                ((unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)&local_940);
    }
  }
  return uVar21;
}

Assistant:

unsigned int ProcessMaterials(uint64_t id, unsigned int prevMatId, ConversionData& conv, bool forceDefaultMat) {
    STEP::DB::RefMapRange range = conv.db.GetRefs().equal_range(id);
    for(;range.first != range.second; ++range.first) {
        if(const IFC::Schema_2x3::IfcStyledItem* const styled = conv.db.GetObject((*range.first).second)->ToPtr<IFC::Schema_2x3::IfcStyledItem>()) {
            for(const IFC::Schema_2x3::IfcPresentationStyleAssignment& as : styled->Styles) {
                for(std::shared_ptr<const IFC::Schema_2x3::IfcPresentationStyleSelect> sel : as.Styles) {

                    if( const IFC::Schema_2x3::IfcSurfaceStyle* const surf = sel->ResolveSelectPtr<IFC::Schema_2x3::IfcSurfaceStyle>(conv.db) ) {
                        // try to satisfy from cache
                        ConversionData::MaterialCache::iterator mit = conv.cached_materials.find(surf);
                        if( mit != conv.cached_materials.end() )
                            return mit->second;

                        // not found, create new material
                        const std::string side = static_cast<std::string>(surf->Side);
                        if( side != "BOTH" ) {
                            IFCImporter::LogWarn("ignoring surface side marker on IFC::IfcSurfaceStyle: " + side);
                        }

                        std::unique_ptr<aiMaterial> mat(new aiMaterial());

                        FillMaterial(mat.get(), surf, conv);

                        conv.materials.push_back(mat.release());
                        unsigned int matindex = static_cast<unsigned int>(conv.materials.size() - 1);
                        conv.cached_materials[surf] = matindex;
                        return matindex;
                    }
                }
            }
        }
    }

    // no local material defined. If there's global one, use that instead
    if ( prevMatId != std::numeric_limits<uint32_t>::max() ) {
        return prevMatId;
    }

    // we're still here - create an default material if required, or simply fail otherwise
    if ( !forceDefaultMat ) {
        return std::numeric_limits<uint32_t>::max();
    }

    aiString name;
    name.Set("<IFCDefault>");
    //  ConvertColorToString( color, name);

    // look if there's already a default material with this base color
    for( size_t a = 0; a < conv.materials.size(); ++a ) {
        aiString mname;
        conv.materials[a]->Get(AI_MATKEY_NAME, mname);
        if ( name == mname ) {
            return ( unsigned int )a;
        }
    }

    // we're here, yet - no default material with suitable color available. Generate one
    std::unique_ptr<aiMaterial> mat(new aiMaterial());
    mat->AddProperty(&name,AI_MATKEY_NAME);

    const aiColor4D col = aiColor4D( 0.6f, 0.6f, 0.6f, 1.0f); // aiColor4D( color.r, color.g, color.b, 1.0f);
    mat->AddProperty(&col,1, AI_MATKEY_COLOR_DIFFUSE);

    conv.materials.push_back(mat.release());
    return (unsigned int) conv.materials.size() - 1;
}